

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void replace_tokens_of_type(List *list,TokenType old,TokenType new)

{
  TokenType new_local;
  TokenType old_local;
  List *list_local;
  
  if (list != (List *)0x0) {
    if ((list->token).type == old) {
      (list->token).type = new;
    }
    replace_tokens_of_type(list->car,old,new);
    replace_tokens_of_type(list->cdr,old,new);
  }
  return;
}

Assistant:

void
replace_tokens_of_type (List *list, TokenType old, TokenType new)
{
  if (list == NULL)
    return;
  if (list->token.type == old)
    list->token.type = new;
  replace_tokens_of_type (list->car, old, new);
  replace_tokens_of_type (list->cdr, old, new);
}